

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QByteArray *
toCase_template<QByteArray_const>
          (QByteArray *__return_storage_ptr__,QByteArray *input,_func_uchar_uchar *lookup)

{
  long lVar1;
  uchar uVar2;
  uchar uVar3;
  char *pcVar4;
  long lVar5;
  
  pcVar4 = (input->d).ptr;
  lVar1 = (input->d).size;
  lVar5 = 0;
  while( true ) {
    if (lVar1 == lVar5) {
      QArrayDataPointer<char>::QArrayDataPointer(&__return_storage_ptr__->d,&input->d);
      return __return_storage_ptr__;
    }
    uVar3 = pcVar4[lVar5];
    uVar2 = (*lookup)(uVar3);
    if (uVar3 != uVar2) break;
    lVar5 = lVar5 + 1;
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QArrayDataPointer<char>::QArrayDataPointer(&__return_storage_ptr__->d,&input->d);
  pcVar4 = QByteArray::data(__return_storage_ptr__);
  lVar1 = (__return_storage_ptr__->d).size;
  for (; lVar1 != lVar5; lVar5 = lVar5 + 1) {
    uVar3 = (*lookup)(pcVar4[lVar5]);
    pcVar4[lVar5] = uVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

static QByteArray toCase_template(T &input, uchar (*lookup)(uchar))
{
    // find the first bad character in input
    const char *orig_begin = input.constBegin();
    const char *firstBad = orig_begin;
    const char *e = input.constEnd();
    for ( ; firstBad != e ; ++firstBad) {
        uchar ch = uchar(*firstBad);
        uchar converted = lookup(ch);
        if (ch != converted)
            break;
    }

    if (firstBad == e)
        return std::move(input);

    // transform the rest
    QByteArray s = std::move(input);    // will copy if T is const QByteArray
    char *b = s.begin();            // will detach if necessary
    char *p = b + (firstBad - orig_begin);
    e = b + s.size();
    for ( ; p != e; ++p)
        *p = char(lookup(uchar(*p)));
    return s;
}